

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CoverCrossSymbol::addBody(CoverCrossSymbol *this,CoverCrossSyntax *syntax,Scope *scope)

{
  SourceLocation *args_1;
  Compilation *args;
  pointer ppCVar1;
  size_t sVar2;
  long lVar3;
  pointer ppMVar4;
  CoverageOptionSyntax *syntax_00;
  string_view name;
  CoverCrossBodySymbol *symbol;
  Type *fieldType;
  TypeAliasType *pTVar5;
  QueueType *pQVar6;
  Scope *scope_00;
  long lVar7;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> sVar8;
  LookupLocation lookupLocation;
  StructBuilder valType;
  OptionBuilder optionBuilder;
  StructBuilder local_218;
  OptionBuilder local_1f8;
  
  args = scope->compilation;
  args_1 = &(this->super_Symbol).location;
  symbol = BumpAllocator::
           emplace<slang::ast::CoverCrossBodySymbol,slang::ast::Compilation&,slang::SourceLocation&>
                     (&args->super_BumpAllocator,args,args_1);
  Scope::addMember(&this->super_Scope,&symbol->super_Symbol);
  scope_00 = &symbol->super_Scope;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)0x0;
  lookupLocation.index = 0;
  StructBuilder::StructBuilder(&local_218,scope_00,lookupLocation);
  ppCVar1 = (this->targets)._M_ptr;
  sVar2 = (this->targets)._M_extent._M_extent_value;
  for (lVar7 = 0; sVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
    lVar3 = *(long *)((long)ppCVar1 + lVar7);
    name = *(string_view *)(lVar3 + 8);
    fieldType = DeclaredType::getType((DeclaredType *)(lVar3 + 0x78));
    StructBuilder::addField(&local_218,name,fieldType,(bitmask<slang::ast::VariableFlags>)0x0);
  }
  pTVar5 = BumpAllocator::
           emplace<slang::ast::TypeAliasType,char_const(&)[13],slang::SourceLocation&>
                     (&args->super_BumpAllocator,(char (*) [13])"CrossValType",args_1);
  (pTVar5->targetType).type = &(local_218.type)->super_Type;
  Scope::addMember(scope_00,(Symbol *)pTVar5);
  local_1f8.scope._0_4_ = 0;
  pQVar6 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::TypeAliasType&,unsigned_int>
                     (&args->super_BumpAllocator,pTVar5,(uint *)&local_1f8);
  pTVar5 = BumpAllocator::
           emplace<slang::ast::TypeAliasType,char_const(&)[15],slang::SourceLocation&>
                     (&args->super_BumpAllocator,(char (*) [15])"CrossQueueType",args_1);
  (pTVar5->targetType).type = &pQVar6->super_Type;
  Scope::addMember(scope_00,(Symbol *)pTVar5);
  symbol->crossQueueType = &pTVar5->super_Type;
  anon_unknown.dwarf_619fee::OptionBuilder::OptionBuilder(&local_1f8,&this->super_Scope);
  ppMVar4 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            _M_ptr;
  sVar2 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  for (lVar7 = 0; sVar2 << 3 != lVar7; lVar7 = lVar7 + 8) {
    syntax_00 = *(CoverageOptionSyntax **)((long)ppMVar4 + lVar7);
    if ((syntax_00->super_MemberSyntax).super_SyntaxNode.kind == CoverageOption) {
      anon_unknown.dwarf_619fee::OptionBuilder::add(&local_1f8,syntax_00);
    }
    else {
      Scope::addMembers(scope_00,(SyntaxNode *)syntax_00);
    }
  }
  sVar8 = anon_unknown.dwarf_619fee::OptionBuilder::get(&local_1f8);
  this->options = sVar8;
  anon_unknown.dwarf_619fee::OptionBuilder::~OptionBuilder(&local_1f8);
  return;
}

Assistant:

void CoverCrossSymbol::addBody(const syntax::CoverCrossSyntax& syntax, const Scope& scope) {
    auto& comp = scope.getCompilation();
    auto body = comp.emplace<CoverCrossBodySymbol>(comp, location);
    addMember(*body);

    StructBuilder valType(*body, LookupLocation::min);
    for (auto item : targets)
        valType.addField(item->name, item->declaredType.getType());

    auto valType_t = comp.emplace<TypeAliasType>("CrossValType", location);
    valType_t->targetType.setType(valType.type);
    body->addMember(*valType_t);

    auto queueType = comp.emplace<QueueType>(*valType_t, 0u);
    auto queueType_t = comp.emplace<TypeAliasType>("CrossQueueType", location);
    queueType_t->targetType.setType(*queueType);
    body->addMember(*queueType_t);
    body->crossQueueType = queueType_t;

    OptionBuilder optionBuilder(*this);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            optionBuilder.add(member->as<CoverageOptionSyntax>());
        else
            body->addMembers(*member);
    }

    options = optionBuilder.get();
}